

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsAppsExport.cpp
# Opt level: O2

void helicsAppFree(HelicsApp app)

{
  MasterObjectHolder *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  if ((app != (HelicsApp)0x0) && (*(int *)((long)app + 0x34) == 0x7a8f1c4d)) {
    *(undefined4 *)((long)app + 0x34) = 0;
    getMasterHolder();
    MasterObjectHolder::clearApp(local_20,*(int *)((long)app + 0x30));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  }
  helics::CoreFactory::cleanUpCores();
  return;
}

Assistant:

void helicsAppFree(HelicsApp app)
{
    auto* appObj = helics::getAppObject(app, nullptr);
    if (appObj != nullptr) {
        appObj->valid = 0;
        getMasterHolder()->clearApp(appObj->index);
    }

    helics::CoreFactory::cleanUpCores();
}